

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_SHAPECHANGE(effect_handler_context_t_conflict *context)

{
  effect *effect;
  player_shape *ppVar1;
  source sVar2;
  source origin;
  _Bool local_19;
  player_shape *ppStack_18;
  _Bool ident;
  player_shape *shape;
  effect_handler_context_t_conflict *context_local;
  
  shape = (player_shape *)context;
  ppStack_18 = player_shape_by_idx(context->subtype);
  local_19 = false;
  if (ppStack_18 != (player_shape *)0x0) {
    ppVar1 = lookup_player_shape(ppStack_18->name);
    player->shape = ppVar1;
    msg("You assume the shape of a %s!",ppStack_18->name);
    msg("Your gear merges into your body.");
    if (ppStack_18->effect != (effect *)0x0) {
      effect = ppStack_18->effect;
      sVar2 = source_player();
      origin.which = sVar2.which;
      origin._4_4_ = 0;
      origin.what = sVar2.what;
      effect_do(effect,origin,(object *)0x0,&local_19,true,L'\0',L'\0',L'\0',(command_conflict *)0x0
               );
    }
    shape_learn_on_assume(player,ppStack_18->name);
    player->upkeep->update = player->upkeep->update | 1;
    player->upkeep->redraw = player->upkeep->redraw | 3;
    handle_stuff(player);
    return true;
  }
  __assert_fail("shape",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                ,0xe15,"_Bool effect_handler_SHAPECHANGE(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_SHAPECHANGE(effect_handler_context_t *context)
{
	struct player_shape *shape = player_shape_by_idx(context->subtype);
	bool ident = false;

	assert(shape);

	/* Change shape */
	player->shape = lookup_player_shape(shape->name);
	msg("You assume the shape of a %s!", shape->name);
	msg("Your gear merges into your body.");

	/* Do effect */
	if (shape->effect) {
		(void) effect_do(shape->effect, source_player(), NULL, &ident, true,
						 0, 0, 0, NULL);
	}

	/* Update */
	shape_learn_on_assume(player, shape->name);
	player->upkeep->update |= (PU_BONUS);
	player->upkeep->redraw |= (PR_TITLE | PR_MISC);
	handle_stuff(player);

	return true;
}